

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::inherit_expression_dependencies
          (Compiler *this,uint32_t dst,uint32_t source_expression)

{
  bool bVar1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  TypedID<(spirv_cross::Types)0> *insert_end;
  bool local_6d;
  TypedID<(spirv_cross::Types)0> local_6c;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *local_68;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *s_deps;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *e_deps;
  SPIRExpression *s;
  SPIRVariable *local_48;
  SPIRVariable *phi;
  SPIRExpression *e;
  _Node_iterator_base<unsigned_int,_false> local_30;
  _Node_iterator_base<unsigned_int,_false> local_28;
  _Node_iterator_base<unsigned_int,_false> local_20;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t source_expression_local;
  uint32_t dst_local;
  Compiler *this_local;
  
  local_18 = source_expression;
  local_14 = dst;
  _source_expression_local = this;
  local_20._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(&this->forwarded_temporaries,&local_14);
  local_28._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                 (&this->forwarded_temporaries);
  bVar1 = ::std::__detail::operator==(&local_20,&local_28);
  local_6d = true;
  if (!bVar1) {
    local_30._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&this->forced_temporaries,&local_14);
    e = (SPIRExpression *)
        ::std::
        end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                  (&this->forced_temporaries);
    local_6d = ::std::__detail::operator!=(&local_30,(_Node_iterator_base<unsigned_int,_false> *)&e)
    ;
  }
  if (local_6d == false) {
    phi = (SPIRVariable *)get<spirv_cross::SPIRExpression>(this,local_14);
    local_48 = maybe_get<spirv_cross::SPIRVariable>(this,local_18);
    if ((local_48 != (SPIRVariable *)0x0) && ((local_48->phi_variable & 1U) != 0)) {
      pSVar2 = &local_48->dependees;
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)((long)&s + 4),local_14);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                (pSVar2,(TypedID<(spirv_cross::Types)0> *)((long)&s + 4));
    }
    e_deps = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
             maybe_get<spirv_cross::SPIRExpression>(this,local_18);
    if ((SPIRExpression *)e_deps != (SPIRExpression *)0x0) {
      pSVar2 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
               ((phi->dereference_chain).stack_storage.aligned_char + 8);
      local_68 = &((SPIRExpression *)e_deps)->expression_dependencies;
      s_deps = pSVar2;
      TypedID<(spirv_cross::Types)0>::TypedID(&local_6c,local_18);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back(pSVar2,&local_6c);
      pSVar2 = s_deps;
      pTVar3 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         (s_deps);
      pTVar4 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         (local_68);
      insert_end = ::std::
                   end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                             (local_68);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::insert
                (pSVar2,pTVar3,pTVar4,insert_end);
      pTVar3 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         (s_deps);
      pTVar4 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         (s_deps);
      ::std::sort<spirv_cross::TypedID<(spirv_cross::Types)0>*>(pTVar3,pTVar4);
      pSVar2 = s_deps;
      pTVar3 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         (s_deps);
      pTVar4 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         (s_deps);
      pTVar3 = ::std::unique<spirv_cross::TypedID<(spirv_cross::Types)0>*>(pTVar3,pTVar4);
      pTVar4 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         (s_deps);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::erase(pSVar2,pTVar3,pTVar4);
    }
  }
  return;
}

Assistant:

void Compiler::inherit_expression_dependencies(uint32_t dst, uint32_t source_expression)
{
	// Don't inherit any expression dependencies if the expression in dst
	// is not a forwarded temporary.
	if (forwarded_temporaries.find(dst) == end(forwarded_temporaries) ||
	    forced_temporaries.find(dst) != end(forced_temporaries))
	{
		return;
	}

	auto &e = get<SPIRExpression>(dst);
	auto *phi = maybe_get<SPIRVariable>(source_expression);
	if (phi && phi->phi_variable)
	{
		// We have used a phi variable, which can change at the end of the block,
		// so make sure we take a dependency on this phi variable.
		phi->dependees.push_back(dst);
	}

	auto *s = maybe_get<SPIRExpression>(source_expression);
	if (!s)
		return;

	auto &e_deps = e.expression_dependencies;
	auto &s_deps = s->expression_dependencies;

	// If we depend on a expression, we also depend on all sub-dependencies from source.
	e_deps.push_back(source_expression);
	e_deps.insert(end(e_deps), begin(s_deps), end(s_deps));

	// Eliminate duplicated dependencies.
	sort(begin(e_deps), end(e_deps));
	e_deps.erase(unique(begin(e_deps), end(e_deps)), end(e_deps));
}